

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

void set_str(uchar *p,char *s,size_t l,char f,char *map)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  undefined7 in_register_00000009;
  byte bVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  pbVar3 = (byte *)0x265937;
  if (s != (char *)0x0) {
    pbVar3 = (byte *)s;
  }
  bVar4 = *pbVar3;
  bVar6 = l != 0;
  if (bVar6 && bVar4 != 0) {
    lVar5 = 0;
    do {
      if ((((char)bVar4 < '\0') ||
          (*(char *)(CONCAT71(in_register_00000009,f) + (ulong)bVar4) == '\0')) &&
         (bVar1 = bVar4 + 0x9f, bVar4 = bVar4 - 0x20, 0x19 < bVar1)) {
        bVar4 = 0x5f;
      }
      p[lVar5] = bVar4;
      bVar4 = pbVar3[lVar5 + 1];
      bVar6 = l - 1 != lVar5;
      lVar2 = lVar5 + 1;
    } while ((bVar4 != 0) && (bVar7 = l - 1 != lVar5, lVar5 = lVar2, bVar7));
    p = p + lVar2;
    l = l - lVar2;
  }
  if (bVar6) {
    memset(p,0x20,l);
    return;
  }
  return;
}

Assistant:

static void
set_str(unsigned char *p, const char *s, size_t l, char f, const char *map)
{
	unsigned char c;

	if (s == NULL)
		s = "";
	while ((c = *s++) != 0 && l > 0) {
		if (c >= 0x80 || map[c] == 0)
		 {
			/* illegal character */
			if (c >= 'a' && c <= 'z') {
				/* convert c from a-z to A-Z */
				c -= 0x20;
			} else
				c = 0x5f;
		}
		*p++ = c;
		l--;
	}
	/* If l isn't zero, fill p buffer by the character
	 * which indicated by f. */
	if (l > 0)
		memset(p , f, l);
}